

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O2

vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *
tinyusdz::lerp<tinyusdz::value::vector3f>
          (vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
           *__return_storage_ptr__,
          vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *a,
          vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_> *b,double t)

{
  pointer pvVar1;
  ulong __new_size;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  vector3f vVar5;
  
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>)._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>)._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>)._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  __new_size = ((long)(a->
                      super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(a->
                     super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                     )._M_impl.super__Vector_impl_data._M_start) / 0xc;
  uVar2 = ((long)(b->
                 super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
          (long)(b->
                super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                )._M_impl.super__Vector_impl_data._M_start) / 0xc;
  if (uVar2 < __new_size) {
    __new_size = uVar2;
  }
  if (__new_size != 0) {
    ::std::vector<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>::resize
              (__return_storage_ptr__,__new_size);
    if ((long)(a->
              super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(a->
              super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
              )._M_impl.super__Vector_impl_data._M_start ==
        (long)(b->
              super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(b->
              super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
              )._M_impl.super__Vector_impl_data._M_start) {
      lVar3 = 0;
      while (bVar4 = __new_size != 0, __new_size = __new_size - 1, bVar4) {
        vVar5 = lerp<tinyusdz::value::vector3f>
                          ((vector3f *)
                           ((long)&((a->
                                    super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                    )._M_impl.super__Vector_impl_data._M_start)->x + lVar3),
                           (vector3f *)
                           ((long)&((b->
                                    super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                                    )._M_impl.super__Vector_impl_data._M_start)->x + lVar3),t);
        pvVar1 = (__return_storage_ptr__->
                 super__Vector_base<tinyusdz::value::vector3f,_std::allocator<tinyusdz::value::vector3f>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        *(long *)((long)&pvVar1->x + lVar3) = vVar5._0_8_;
        *(float *)((long)&pvVar1->z + lVar3) = vVar5.z;
        lVar3 = lVar3 + 0xc;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}